

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracer.cpp
# Opt level: O0

RGB __thiscall
RayTracer::processPixelOnPlane
          (RayTracer *this,Point *rayBeg,Point *pointOnPlane,const_iterator planeIt,
          int recursionLevel)

{
  RGB *pRVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  bool bVar4;
  RGB RVar5;
  const_iterator cVar6;
  __normal_iterator<const_Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_> begin;
  const_iterator begin_00;
  pointer pPVar7;
  reference plane;
  Point PVar8;
  bool local_111;
  RGB local_110;
  RGB local_108;
  undefined1 auStack_f8 [5];
  RGB reflectedColor;
  undefined1 local_dc [8];
  Segment refl;
  float fStack_bc;
  float local_b8;
  Vector local_90;
  undefined2 local_7e;
  uint8_t local_7c;
  undefined2 local_7b;
  uint8_t local_79;
  RGB local_78;
  undefined2 local_72;
  uint8_t local_70;
  undefined2 local_6e;
  uint8_t local_6c;
  undefined2 local_6b;
  uint8_t local_69;
  const_iterator cStack_68;
  RGB resultCol;
  bool isInShadow;
  int recursionLevel_local;
  Point *pointOnPlane_local;
  Point *rayBeg_local;
  RayTracer *this_local;
  const_iterator planeIt_local;
  
  this_local = (RayTracer *)planeIt._M_current;
  cVar6 = std::vector<Plane,_std::allocator<Plane>_>::cbegin
                    (&(this->super_RayTracerBase).config.planes);
  bVar4 = pointInShadow<__gnu_cxx::__normal_iterator<Plane_const*,std::vector<Plane,std::allocator<Plane>>>>
                    (pointOnPlane,&(this->super_RayTracerBase).config.super_BaseConfig.light,
                     (__normal_iterator<const_Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>)
                     cVar6._M_current,
                     (__normal_iterator<const_Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>)
                     this_local);
  local_111 = true;
  if (!bVar4) {
    begin = __gnu_cxx::__normal_iterator<const_Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>
            ::operator+((__normal_iterator<const_Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>
                         *)&this_local,1);
    cVar6 = std::vector<Plane,_std::allocator<Plane>_>::cend
                      (&(this->super_RayTracerBase).config.planes);
    bVar4 = pointInShadow<__gnu_cxx::__normal_iterator<Plane_const*,std::vector<Plane,std::allocator<Plane>>>>
                      (pointOnPlane,&(this->super_RayTracerBase).config.super_BaseConfig.light,begin
                       ,(__normal_iterator<const_Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>
                         )cVar6._M_current);
    local_111 = true;
    if (!bVar4) {
      begin_00 = std::vector<Sphere,_std::allocator<Sphere>_>::cbegin
                           (&(this->super_RayTracerBase).config.spheres);
      cStack_68 = std::vector<Sphere,_std::allocator<Sphere>_>::cend
                            (&(this->super_RayTracerBase).config.spheres);
      local_111 = pointInShadow<__gnu_cxx::__normal_iterator<Sphere_const*,std::vector<Sphere,std::allocator<Sphere>>>>
                            (pointOnPlane,&(this->super_RayTracerBase).config.super_BaseConfig.light
                             ,(__normal_iterator<const_Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>
                               )begin_00._M_current,
                             (__normal_iterator<const_Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>
                              )cStack_68._M_current);
    }
  }
  if (local_111 == false) {
    pPVar7 = __gnu_cxx::
             __normal_iterator<const_Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>::
             operator->((__normal_iterator<const_Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>
                         *)&this_local);
    local_7c = (pPVar7->color).b;
    local_7e._0_1_ = (pPVar7->color).r;
    local_7e._1_1_ = (pPVar7->color).g;
    pPVar7 = __gnu_cxx::
             __normal_iterator<const_Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>::
             operator->((__normal_iterator<const_Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>
                         *)&this_local);
    PVar8 = operator-((this->super_RayTracerBase).config.super_BaseConfig.light,pointOnPlane);
    local_b8 = PVar8.z;
    local_90.z = local_b8;
    stack0xffffffffffffff40 = PVar8._0_8_;
    local_90.x = refl.b.z;
    local_90.y = fStack_bc;
    refl.b.y._2_1_ = local_7c;
    refl.b.y._0_2_ = local_7e;
    unique0x10000528 = PVar8;
    RVar5 = calculateColorInLight(this,refl.b.y._0_3_,&pPVar7->normal,&local_90);
    local_7b = RVar5._0_2_;
    local_79 = RVar5.b;
    local_6b = local_7b;
    local_69 = local_79;
  }
  else {
    pPVar7 = __gnu_cxx::
             __normal_iterator<const_Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>::
             operator->((__normal_iterator<const_Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>
                         *)&this_local);
    local_70 = (pPVar7->color).b;
    pRVar1 = &pPVar7->color;
    local_72._0_1_ = pRVar1->r;
    local_72._1_1_ = pRVar1->g;
    local_78 = *pRVar1;
    RVar5 = operator*(local_78,(this->super_RayTracerBase).config.super_BaseConfig.
                               ambientCoefficient);
    local_6e = RVar5._0_2_;
    local_6c = RVar5.b;
    local_6b = local_6e;
    local_69 = local_6c;
  }
  if (recursionLevel < (this->super_RayTracerBase).config.super_BaseConfig.maxRecursionLevel) {
    pPVar7 = __gnu_cxx::
             __normal_iterator<const_Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>::
             operator->((__normal_iterator<const_Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>
                         *)&this_local);
    bVar4 = isCloseToZero<float>(pPVar7->reflectionCoefficient);
    if (!bVar4) {
      auStack_f8._0_4_ = rayBeg->x;
      unique0x00012004 = rayBeg->y;
      plane = __gnu_cxx::
              __normal_iterator<const_Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>::
              operator*((__normal_iterator<const_Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>
                         *)&this_local);
      reflection((Segment *)local_dc,(Segment *)auStack_f8,plane);
      RVar5 = processPixel(this,(Segment *)local_dc,recursionLevel + 1);
      local_108.b = local_69;
      uVar2 = local_6b;
      pPVar7 = __gnu_cxx::
               __normal_iterator<const_Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>::
               operator->((__normal_iterator<const_Plane_*,_std::vector<Plane,_std::allocator<Plane>_>_>
                           *)&this_local);
      uVar3 = local_6b;
      local_6b._0_1_ = (undefined1)uVar2;
      local_6b._1_1_ = SUB21(uVar2,1);
      local_108.r = (undefined1)local_6b;
      local_108.g = local_6b._1_1_;
      local_6b = uVar3;
      RVar5 = calculateColorFromReflection(local_108,RVar5,pPVar7->reflectionCoefficient);
      planeIt_local._M_current._5_2_ = RVar5._0_2_;
      planeIt_local._M_current._7_1_ = RVar5.b;
      goto LAB_00113481;
    }
  }
  planeIt_local._M_current._5_2_ = local_6b;
  planeIt_local._M_current._7_1_ = local_69;
LAB_00113481:
  local_110.b = planeIt_local._M_current._7_1_;
  local_110.r = planeIt_local._M_current._5_1_;
  local_110.g = planeIt_local._M_current._6_1_;
  return local_110;
}

Assistant:

RGB RayTracer::processPixelOnPlane(Point const& rayBeg, Point const& pointOnPlane,
                                   std::vector<Plane>::const_iterator planeIt, int recursionLevel)
{
  bool const isInShadow =
      pointInShadow(pointOnPlane, config.light, config.planes.cbegin(), planeIt)
      || pointInShadow(pointOnPlane, config.light, planeIt + 1, config.planes.cend())
      || pointInShadow(pointOnPlane, config.light, config.spheres.cbegin(), config.spheres.cend());

  RGB resultCol;
  if (isInShadow)
    resultCol = planeIt->color * config.ambientCoefficient;
  else
    resultCol = calculateColorInLight(planeIt->color, planeIt->normal, config.light - pointOnPlane);

  if (recursionLevel >= config.maxRecursionLevel || isCloseToZero(planeIt->reflectionCoefficient))
    return resultCol;

  Segment refl = reflection({rayBeg, pointOnPlane}, *planeIt);
  RGB reflectedColor = processPixel(refl, recursionLevel + 1);

  return calculateColorFromReflection(resultCol, reflectedColor, planeIt->reflectionCoefficient);
}